

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

int rnd_class(int first,int last)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  short *psVar5;
  long lVar6;
  long lVar7;
  
  if (last - first != 0) {
    lVar7 = (long)first;
    psVar5 = &objects[lVar7].oc_prob;
    iVar3 = 0;
    for (lVar6 = lVar7; lVar6 <= last; lVar6 = lVar6 + 1) {
      iVar3 = iVar3 + *psVar5;
      psVar5 = psVar5 + 0x14;
    }
    if (iVar3 == 0) {
      iVar3 = rn2((last - first) + 1);
      first = first + iVar3;
    }
    else {
      iVar3 = rnd(iVar3);
      psVar5 = &objects[lVar7].oc_prob;
      for (; lVar7 <= last; lVar7 = lVar7 + 1) {
        sVar1 = *psVar5;
        if ((sVar1 != 0) &&
           (iVar4 = iVar3 - sVar1, bVar2 = iVar3 < sVar1, iVar3 = iVar4, iVar4 == 0 || bVar2)) {
          return (int)lVar7;
        }
        psVar5 = psVar5 + 0x14;
      }
      first = 0;
    }
  }
  return first;
}

Assistant:

int rnd_class(int first, int last)
{
	int i, x, sum=0;

	if (first == last)
	    return first;
	for (i=first; i<=last; i++)
		sum += objects[i].oc_prob;
	if (!sum) /* all zero */
		return first + rn2(last-first+1);
	x = rnd(sum);
	for (i=first; i<=last; i++)
		if (objects[i].oc_prob && (x -= objects[i].oc_prob) <= 0)
			return i;
	return 0;
}